

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void neon_store_reg(TCGContext_conflict1 *tcg_ctx,int reg,int pass,TCGv_i32 var)

{
  TCGv_ptr arg2;
  long offset;
  uintptr_t o;
  
  arg2 = tcg_ctx->cpu_env;
  offset = neon_reg_offset(reg,pass);
  tcg_gen_st_i32(tcg_ctx,var,arg2,offset);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
  return;
}

Assistant:

static void neon_store_reg(TCGContext *tcg_ctx, int reg, int pass, TCGv_i32 var)
{
    tcg_gen_st_i32(tcg_ctx, var, tcg_ctx->cpu_env, neon_reg_offset(reg, pass));
    tcg_temp_free_i32(tcg_ctx, var);
}